

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O1

Expression __thiscall
dynet::NaryTreeLSTMBuilder::add_input
          (NaryTreeLSTMBuilder *this,int id,vector<int,_std::allocator<int>_> *children,
          Expression *x)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  undefined8 *puVar5;
  pointer pEVar6;
  VariableIndex VVar7;
  ComputationGraph *extraout_RAX;
  Expression *pEVar8;
  undefined8 extraout_RDX;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  iterator __begin3;
  int *piVar16;
  pointer pCVar17;
  bool bVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Db_02;
  initializer_list<dynet::Expression> __l;
  initializer_list<dynet::Expression> __l_00;
  initializer_list<dynet::Expression> __l_01;
  initializer_list<dynet::Expression> __l_02;
  Expression EVar21;
  Expression ph_t;
  Expression i_ot;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> i_ft;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> i_h_children;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> i_c_children;
  Expression i_crt;
  Expression in;
  Expression i_wt;
  Expression i_it;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_180;
  undefined1 local_168 [48];
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_138;
  pointer local_118;
  pointer local_110;
  ulong local_108;
  allocator_type local_f9;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_f8;
  Expression local_d8;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_c8;
  Expression local_a8;
  ComputationGraph *local_98;
  pointer puStack_90;
  pointer local_80;
  Expression local_78;
  pointer local_68;
  Expression local_60;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_50;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_48;
  Expression local_40;
  
  local_118 = (pointer)children;
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_168,
             (ulong)this->layers,(allocator_type *)&local_f8);
  local_48 = &this->h;
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)local_48,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_168)
  ;
  if ((ComputationGraph *)local_168._0_8_ != (ComputationGraph *)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_168,
             (ulong)this->layers,(allocator_type *)&local_f8);
  local_50 = &this->c;
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)local_50,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_168)
  ;
  if ((ComputationGraph *)local_168._0_8_ != (ComputationGraph *)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  local_68 = (this->h).
             super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_80 = (this->c).
             super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_98 = x->pg;
  puStack_90 = *(pointer *)&x->i;
  if (this->layers != 0) {
    local_108 = 0;
    pCVar17 = local_118;
    do {
      local_110 = (this->param_vars).
                  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_108;
      local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (Expression *)0x0;
      local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_finish = (Expression *)0x0;
      local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (Expression *)0x0;
      local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_finish = (Expression *)0x0;
      lVar13 = (long)(pCVar17->device_mem_checkpoint).used[0] - *(long *)pCVar17 >> 2;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                (&local_f8,lVar13 + (ulong)(lVar13 == 0));
      lVar13 = (long)(pCVar17->device_mem_checkpoint).used[0] - *(long *)pCVar17 >> 2;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                (&local_c8,lVar13 + (ulong)(lVar13 == 0));
      piVar16 = *(int **)pCVar17;
      piVar4 = (int *)(pCVar17->device_mem_checkpoint).used[0];
      bVar1 = this->has_initial_state;
      bVar18 = piVar4 == piVar16;
      if (bVar18) {
        local_168._0_16_ = ZEXT816(0);
        if (local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
          _M_realloc_insert<dynet::Expression>
                    (&local_f8,
                     (iterator)
                     local_f8.
                     super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Expression *)local_168);
        }
        else {
          (local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_finish)->pg = (ComputationGraph *)0x0;
          (local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_finish)->i = 0;
          (local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_finish)->graph_id = 0;
          local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_finish =
               local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_168._0_16_ = ZEXT816(0);
        if (local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
          _M_realloc_insert<dynet::Expression>
                    (&local_c8,
                     (iterator)
                     local_c8.
                     super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Expression *)local_168);
        }
        else {
          (local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_finish)->pg = (ComputationGraph *)0x0;
          (local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_finish)->i = 0;
          (local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_finish)->graph_id = 0;
          local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_finish =
               local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (this->has_initial_state == true) {
          pEVar6 = (this->h0).
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_start + local_108;
          VVar7 = pEVar6->i;
          uVar10 = pEVar6->graph_id;
          (local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start)->pg = pEVar6->pg;
          (local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start)->i = VVar7;
          (local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start)->graph_id = uVar10;
          pEVar6 = (this->c0).
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_start + local_108;
          VVar7 = pEVar6->i;
          uVar10 = pEVar6->graph_id;
          (local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start)->pg = pEVar6->pg;
          (local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start)->i = VVar7;
          (local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start)->graph_id = uVar10;
        }
      }
      else {
        do {
          iVar2 = *piVar16;
          lVar13 = local_108 * 0x10;
          pEVar8 = (Expression *)
                   (*(long *)&(local_48->
                              super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[iVar2].
                              super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                              ._M_impl + lVar13);
          if (local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<dynet::Expression,std::allocator<dynet::Expression>>::
            _M_realloc_insert<dynet::Expression_const&>
                      ((vector<dynet::Expression,std::allocator<dynet::Expression>> *)&local_f8,
                       (iterator)
                       local_f8.
                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                       _M_impl.super__Vector_impl_data._M_finish,pEVar8);
          }
          else {
            VVar7 = pEVar8->i;
            uVar10 = pEVar8->graph_id;
            (local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish)->pg = pEVar8->pg;
            (local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish)->i = VVar7;
            (local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish)->graph_id = uVar10;
            local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pEVar8 = (Expression *)
                   (lVar13 + *(long *)&(local_50->
                                       super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[iVar2].
                                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                       ._M_impl);
          if (local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<dynet::Expression,std::allocator<dynet::Expression>>::
            _M_realloc_insert<dynet::Expression_const&>
                      ((vector<dynet::Expression,std::allocator<dynet::Expression>> *)&local_c8,
                       (iterator)
                       local_c8.
                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                       _M_impl.super__Vector_impl_data._M_finish,pEVar8);
          }
          else {
            VVar7 = pEVar8->i;
            uVar10 = pEVar8->graph_id;
            (local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish)->pg = pEVar8->pg;
            (local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish)->i = VVar7;
            (local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish)->graph_id = uVar10;
            local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          piVar16 = piVar16 + 1;
        } while (piVar16 != piVar4);
      }
      local_78 = (Expression)ZEXT816(0);
      if (bVar18 && (bVar1 & 1U) == 0) {
        local_168._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)&(local_110->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl.super__Vector_impl_data + 0x10);
        puVar5 = *(undefined8 **)
                  &(local_110->
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                   _M_impl.super__Vector_impl_data;
        local_168._16_8_ = *puVar5;
        local_168._24_8_ = puVar5[1];
        local_168._32_8_ = local_98;
        local_168._40_8_ = puStack_90;
        local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_168;
        local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
        super__Vector_impl_data._M_finish = (Expression *)0x3;
        local_78 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                             ((initializer_list<dynet::Expression> *)&local_138);
        pCVar17 = local_118;
      }
      else {
        local_168._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)&(local_110->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl.super__Vector_impl_data + 0x10);
        puVar5 = *(undefined8 **)
                  &(local_110->
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                   _M_impl.super__Vector_impl_data;
        local_168._16_8_ = *puVar5;
        local_168._24_8_ = puVar5[1];
        local_168._32_8_ = local_98;
        local_168._40_8_ = puStack_90;
        __l._M_len = 3;
        __l._M_array = (iterator)local_168;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                  (&local_138,__l,(allocator_type *)&local_180);
        pCVar17 = local_118;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                  (&local_138,
                   (long)(local_118->device_mem_checkpoint).used[0] + (3 - *(long *)local_118));
        uVar12 = local_108;
        if ((pointer)(pCVar17->device_mem_checkpoint).used[0] != *(pointer *)pCVar17) {
          uVar11 = 0;
          do {
            uVar9 = (uint)uVar11;
            uVar10 = this->N - 1;
            if (uVar9 < this->N) {
              uVar10 = uVar9;
            }
            local_168._0_16_ = (undefined1  [16])Lookup(this,(uint)uVar12,0,uVar10);
            if (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
              _M_realloc_insert<dynet::Expression>
                        (&local_138,
                         (iterator)
                         local_138.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Expression *)local_168);
            }
            else {
              (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->pg = (ComputationGraph *)local_168._0_8_;
              (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->i = local_168._8_4_;
              (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->graph_id = local_168._12_4_;
              local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_138.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            pEVar8 = local_f8.
                     super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar11;
            if (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dynet::Expression,std::allocator<dynet::Expression>>::
              _M_realloc_insert<dynet::Expression_const&>
                        ((vector<dynet::Expression,std::allocator<dynet::Expression>> *)&local_138,
                         (iterator)
                         local_138.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_finish,pEVar8);
            }
            else {
              VVar7 = pEVar8->i;
              uVar3 = pEVar8->graph_id;
              (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->pg = pEVar8->pg;
              (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->i = VVar7;
              (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->graph_id = uVar3;
              local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_138.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            local_168._0_16_ = (undefined1  [16])Lookup(this,(uint)uVar12,4,uVar10);
            if (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
              _M_realloc_insert<dynet::Expression>
                        (&local_138,
                         (iterator)
                         local_138.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Expression *)local_168);
            }
            else {
              (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->pg = (ComputationGraph *)local_168._0_8_;
              (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->i = local_168._8_4_;
              (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->graph_id = local_168._12_4_;
              local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_138.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            pEVar8 = local_c8.
                     super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar11;
            if (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dynet::Expression,std::allocator<dynet::Expression>>::
              _M_realloc_insert<dynet::Expression_const&>
                        ((vector<dynet::Expression,std::allocator<dynet::Expression>> *)&local_138,
                         (iterator)
                         local_138.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_finish,pEVar8);
            }
            else {
              VVar7 = pEVar8->i;
              uVar10 = pEVar8->graph_id;
              (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->pg = pEVar8->pg;
              (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->i = VVar7;
              (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->graph_id = uVar10;
              local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_138.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            uVar11 = (ulong)(uVar9 + 1);
          } while (uVar11 < (ulong)((long)(pCVar17->device_mem_checkpoint).used[0] -
                                    *(long *)pCVar17 >> 2));
        }
        local_78 = detail::
                   f<dynet::AffineTransform,std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                             (&local_138);
        if ((ExecutionEngine *)
            local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
            _M_impl.super__Vector_impl_data._M_start != (ExecutionEngine *)0x0) {
          operator_delete(local_138.
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
      }
      local_40 = logistic(&local_78);
      local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_finish = (Expression *)0x0;
      local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pointer)(pCVar17->device_mem_checkpoint).used[0] != *(pointer *)pCVar17) {
        uVar12 = 0;
        do {
          uVar9 = (uint)uVar12;
          uVar10 = this->N - 1;
          if (uVar9 < this->N) {
            uVar10 = uVar9;
          }
          local_d8 = (Expression)ZEXT816(0);
          if (bVar18 && (bVar1 & 1U) == 0) {
            local_168._0_16_ =
                 *(undefined1 (*) [16])
                  (*(long *)&(local_110->
                             super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                             )._M_impl.super__Vector_impl_data + 0x30);
            lVar13 = *(long *)&(local_110->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data;
            local_168._16_8_ = *(undefined8 *)(lVar13 + 0x20);
            local_168._24_8_ = *(undefined8 *)(lVar13 + 0x28);
            local_168._32_8_ = local_98;
            local_168._40_8_ = puStack_90;
            local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
            local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_168;
            local_d8 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                                 ((initializer_list<dynet::Expression> *)&local_180);
          }
          else {
            local_168._0_16_ =
                 *(undefined1 (*) [16])
                  (*(long *)&(local_110->
                             super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                             )._M_impl.super__Vector_impl_data + 0x30);
            lVar13 = *(long *)&(local_110->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data;
            local_168._16_8_ = *(undefined8 *)(lVar13 + 0x20);
            local_168._24_8_ = *(undefined8 *)(lVar13 + 0x28);
            local_168._32_8_ = local_98;
            local_168._40_8_ = puStack_90;
            __l_00._M_len = 3;
            __l_00._M_array = (iterator)local_168;
            std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                      (&local_180,__l_00,(allocator_type *)&local_60);
            pCVar17 = local_118;
            std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                      (&local_180,
                       (long)(local_118->device_mem_checkpoint).used[0] + (3 - *(long *)local_118));
            if ((pointer)(pCVar17->device_mem_checkpoint).used[0] != *(pointer *)pCVar17) {
              uVar12 = 0;
              do {
                uVar3 = this->N;
                uVar14 = (uint)uVar12;
                uVar15 = uVar3 - 1;
                if (uVar14 < uVar3) {
                  uVar15 = uVar14;
                }
                local_168._0_16_ =
                     (undefined1  [16])Lookup(this,(uint)local_108,1,uVar3 * uVar15 + uVar10);
                if (local_180.
                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_180.
                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
                  _M_realloc_insert<dynet::Expression>
                            (&local_180,
                             (iterator)
                             local_180.
                             super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(Expression *)local_168);
                }
                else {
                  (local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish)->pg = (ComputationGraph *)local_168._0_8_;
                  (local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish)->i = local_168._8_4_;
                  (local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish)->graph_id = local_168._12_4_;
                  local_180.
                  super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_180.
                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                pEVar8 = local_f8.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar12;
                if (local_180.
                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_180.
                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<dynet::Expression,std::allocator<dynet::Expression>>::
                  _M_realloc_insert<dynet::Expression_const&>
                            ((vector<dynet::Expression,std::allocator<dynet::Expression>> *)
                             &local_180,
                             (iterator)
                             local_180.
                             super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_finish,pEVar8);
                }
                else {
                  VVar7 = pEVar8->i;
                  uVar3 = pEVar8->graph_id;
                  (local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish)->pg = pEVar8->pg;
                  (local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish)->i = VVar7;
                  (local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish)->graph_id = uVar3;
                  local_180.
                  super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_180.
                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                local_168._0_16_ =
                     (undefined1  [16])Lookup(this,(uint)local_108,5,uVar15 * this->N + uVar10);
                if (local_180.
                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_180.
                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
                  _M_realloc_insert<dynet::Expression>
                            (&local_180,
                             (iterator)
                             local_180.
                             super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(Expression *)local_168);
                }
                else {
                  (local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish)->pg = (ComputationGraph *)local_168._0_8_;
                  (local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish)->i = local_168._8_4_;
                  (local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish)->graph_id = local_168._12_4_;
                  local_180.
                  super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_180.
                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                pEVar8 = local_c8.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar12;
                if (local_180.
                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_180.
                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<dynet::Expression,std::allocator<dynet::Expression>>::
                  _M_realloc_insert<dynet::Expression_const&>
                            ((vector<dynet::Expression,std::allocator<dynet::Expression>> *)
                             &local_180,
                             (iterator)
                             local_180.
                             super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_finish,pEVar8);
                }
                else {
                  VVar7 = pEVar8->i;
                  uVar3 = pEVar8->graph_id;
                  (local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish)->pg = pEVar8->pg;
                  (local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish)->i = VVar7;
                  (local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish)->graph_id = uVar3;
                  local_180.
                  super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_180.
                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                uVar12 = (ulong)(uVar14 + 1);
              } while (uVar12 < (ulong)((long)(local_118->device_mem_checkpoint).used[0] -
                                        *(long *)local_118 >> 2));
            }
            local_d8 = detail::
                       f<dynet::AffineTransform,std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                                 (&local_180);
            if ((ComputationGraph *)
                local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start != (ComputationGraph *)0x0) {
              operator_delete(local_180.
                              super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          pCVar17 = local_118;
          local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
          _M_impl.super__Vector_impl_data._0_16_ = operator+(&local_d8,1.0);
          local_168._0_16_ = (undefined1  [16])logistic((Expression *)&local_180);
          if (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
            _M_realloc_insert<dynet::Expression>
                      (&local_138,
                       (iterator)
                       local_138.
                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(Expression *)local_168);
          }
          else {
            (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish)->pg = (ComputationGraph *)local_168._0_8_;
            (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish)->i = (int)local_168._8_8_;
            (local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish)->graph_id =
                 (int)((ulong)local_168._8_8_ >> 0x20);
            local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar12 = (ulong)(uVar9 + 1);
        } while (uVar12 < (ulong)((long)(pCVar17->device_mem_checkpoint).used[0] - *(long *)pCVar17
                                 >> 2));
      }
      local_d8 = (Expression)ZEXT816(0);
      if (bVar18 && (bVar1 & 1U) == 0) {
        local_168._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)&(local_110->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl.super__Vector_impl_data + 0x70);
        lVar13 = *(long *)&(local_110->
                           super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                           )._M_impl.super__Vector_impl_data;
        local_168._16_8_ = *(undefined8 *)(lVar13 + 0x60);
        local_168._24_8_ = *(undefined8 *)(lVar13 + 0x68);
        local_168._32_8_ = local_98;
        local_168._40_8_ = puStack_90;
        local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x3;
        local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_168;
        local_d8 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                             ((initializer_list<dynet::Expression> *)&local_180);
        uVar12 = local_108;
        uVar19 = extraout_XMM0_Da_01;
        uVar20 = extraout_XMM0_Db_01;
      }
      else {
        local_168._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)&(local_110->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl.super__Vector_impl_data + 0x70);
        lVar13 = *(long *)&(local_110->
                           super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                           )._M_impl.super__Vector_impl_data;
        local_168._16_8_ = *(undefined8 *)(lVar13 + 0x60);
        local_168._24_8_ = *(undefined8 *)(lVar13 + 0x68);
        local_168._32_8_ = local_98;
        local_168._40_8_ = puStack_90;
        __l_01._M_len = 3;
        __l_01._M_array = (iterator)local_168;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                  (&local_180,__l_01,(allocator_type *)&local_60);
        uVar12 = local_108;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                  (&local_180,
                   ((long)(pCVar17->device_mem_checkpoint).used[0] - *(long *)pCVar17 >> 1) + 3);
        if ((pointer)(pCVar17->device_mem_checkpoint).used[0] != *(pointer *)pCVar17) {
          uVar11 = 0;
          do {
            uVar9 = (uint)uVar11;
            uVar10 = this->N - 1;
            if (uVar9 < this->N) {
              uVar10 = uVar9;
            }
            local_168._0_16_ = (undefined1  [16])Lookup(this,(uint)uVar12,3,uVar10);
            if (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
              _M_realloc_insert<dynet::Expression>
                        (&local_180,
                         (iterator)
                         local_180.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Expression *)local_168);
            }
            else {
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->pg = (ComputationGraph *)local_168._0_8_;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->i = local_168._8_4_;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->graph_id = local_168._12_4_;
              local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            pEVar8 = local_f8.
                     super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar11;
            if (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dynet::Expression,std::allocator<dynet::Expression>>::
              _M_realloc_insert<dynet::Expression_const&>
                        ((vector<dynet::Expression,std::allocator<dynet::Expression>> *)&local_180,
                         (iterator)
                         local_180.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_finish,pEVar8);
            }
            else {
              VVar7 = pEVar8->i;
              uVar10 = pEVar8->graph_id;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->pg = pEVar8->pg;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->i = VVar7;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->graph_id = uVar10;
              local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            uVar11 = (ulong)(uVar9 + 1);
          } while (uVar11 < (ulong)((long)(pCVar17->device_mem_checkpoint).used[0] -
                                    *(long *)pCVar17 >> 2));
        }
        local_d8 = detail::
                   f<dynet::AffineTransform,std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                             (&local_180);
        uVar19 = extraout_XMM0_Da;
        uVar20 = extraout_XMM0_Db;
        if ((ComputationGraph *)
            local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
            _M_impl.super__Vector_impl_data._M_start != (ComputationGraph *)0x0) {
          operator_delete(local_180.
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                          _M_impl.super__Vector_impl_data._M_start);
          uVar19 = extraout_XMM0_Da_00;
          uVar20 = extraout_XMM0_Db_00;
        }
      }
      tanh((double)CONCAT44(uVar20,uVar19));
      if (bVar18 && (bVar1 & 1U) == 0) {
        EVar21 = cmult(&local_40,&local_60);
        pEVar6 = local_80[-1].
                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pEVar6[uVar12].pg = EVar21.pg;
        pEVar6 = pEVar6 + uVar12;
        pEVar6->i = (int)EVar21._8_8_;
        pEVar6->graph_id = (int)((ulong)EVar21._8_8_ >> 0x20);
      }
      else {
        local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
        super__Vector_impl_data._0_16_ = cmult(&local_40,&local_60);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_168,
                   (long)(pCVar17->device_mem_checkpoint).used[0] - *(long *)pCVar17 >> 2,
                   (allocator_type *)&local_a8);
        if ((pointer)(pCVar17->device_mem_checkpoint).used[0] != *(pointer *)pCVar17) {
          uVar10 = 1;
          uVar11 = 0;
          do {
            EVar21 = cmult((Expression *)
                           (&(local_138.
                              super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pg + uVar11 * 2),
                           local_c8.
                           super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar11);
            (&(((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)local_168._0_8_)->
              super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>)._M_impl.
              super__Vector_impl_data._M_start)[uVar11 * 2] = (pointer)EVar21.pg;
            (&(((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)local_168._0_8_)->
              super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>)._M_impl.
              super__Vector_impl_data._M_finish)[uVar11 * 2] = EVar21._8_8_;
            uVar11 = (ulong)uVar10;
            uVar10 = uVar10 + 1;
          } while (uVar11 < (ulong)((long)(local_118->device_mem_checkpoint).used[0] -
                                    *(long *)local_118 >> 2));
        }
        local_a8 = detail::
                   f<dynet::Sum,std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                             ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                              local_168);
        EVar21 = operator+(&local_a8,(Expression *)&local_180);
        pCVar17 = local_118;
        pEVar6 = local_80[-1].
                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pEVar6[uVar12].pg = EVar21.pg;
        pEVar6 = pEVar6 + uVar12;
        pEVar6->i = (int)EVar21._8_8_;
        pEVar6->graph_id = (int)((ulong)EVar21._8_8_ >> 0x20);
        if ((ComputationGraph *)local_168._0_8_ != (ComputationGraph *)0x0) {
          operator_delete((void *)local_168._0_8_);
        }
      }
      local_a8 = (Expression)ZEXT816(0);
      if (bVar18 && (bVar1 & 1U) == 0) {
        local_168._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)&(local_110->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl.super__Vector_impl_data + 0x50);
        lVar13 = *(long *)&(local_110->
                           super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                           )._M_impl.super__Vector_impl_data;
        local_168._16_8_ = *(undefined8 *)(lVar13 + 0x40);
        local_168._24_8_ = *(undefined8 *)(lVar13 + 0x48);
        local_168._32_8_ = local_98;
        local_168._40_8_ = puStack_90;
        local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x3;
        local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_168;
        local_a8 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                             ((initializer_list<dynet::Expression> *)&local_180);
      }
      else {
        local_168._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)&(local_110->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl.super__Vector_impl_data + 0x50);
        lVar13 = *(long *)&(local_110->
                           super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                           )._M_impl.super__Vector_impl_data;
        local_168._16_8_ = *(undefined8 *)(lVar13 + 0x40);
        local_168._24_8_ = *(undefined8 *)(lVar13 + 0x48);
        local_168._32_8_ = local_98;
        local_168._40_8_ = puStack_90;
        __l_02._M_len = 3;
        __l_02._M_array = (iterator)local_168;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                  (&local_180,__l_02,&local_f9);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                  (&local_180,
                   (long)(pCVar17->device_mem_checkpoint).used[0] + (3 - *(long *)pCVar17));
        if ((pointer)(pCVar17->device_mem_checkpoint).used[0] != *(pointer *)pCVar17) {
          uVar11 = 0;
          do {
            uVar9 = (uint)uVar11;
            uVar10 = this->N - 1;
            if (uVar9 < this->N) {
              uVar10 = uVar9;
            }
            local_168._0_16_ = (undefined1  [16])Lookup(this,(uint)uVar12,2,uVar10);
            if (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
              _M_realloc_insert<dynet::Expression>
                        (&local_180,
                         (iterator)
                         local_180.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Expression *)local_168);
            }
            else {
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->pg = (ComputationGraph *)local_168._0_8_;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->i = local_168._8_4_;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->graph_id = local_168._12_4_;
              local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            pEVar8 = local_f8.
                     super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar11;
            if (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dynet::Expression,std::allocator<dynet::Expression>>::
              _M_realloc_insert<dynet::Expression_const&>
                        ((vector<dynet::Expression,std::allocator<dynet::Expression>> *)&local_180,
                         (iterator)
                         local_180.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_finish,pEVar8);
            }
            else {
              VVar7 = pEVar8->i;
              uVar3 = pEVar8->graph_id;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->pg = pEVar8->pg;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->i = VVar7;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->graph_id = uVar3;
              local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            local_168._0_16_ = (undefined1  [16])Lookup(this,(uint)uVar12,6,uVar10);
            if (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
              _M_realloc_insert<dynet::Expression>
                        (&local_180,
                         (iterator)
                         local_180.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Expression *)local_168);
            }
            else {
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->pg = (ComputationGraph *)local_168._0_8_;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->i = local_168._8_4_;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->graph_id = local_168._12_4_;
              local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            pEVar8 = local_c8.
                     super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar11;
            if (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dynet::Expression,std::allocator<dynet::Expression>>::
              _M_realloc_insert<dynet::Expression_const&>
                        ((vector<dynet::Expression,std::allocator<dynet::Expression>> *)&local_180,
                         (iterator)
                         local_180.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_finish,pEVar8);
            }
            else {
              VVar7 = pEVar8->i;
              uVar10 = pEVar8->graph_id;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->pg = pEVar8->pg;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->i = VVar7;
              (local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish)->graph_id = uVar10;
              local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_180.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            uVar11 = (ulong)(uVar9 + 1);
          } while (uVar11 < (ulong)((long)(pCVar17->device_mem_checkpoint).used[0] -
                                    *(long *)pCVar17 >> 2));
        }
        local_a8 = detail::
                   f<dynet::AffineTransform,std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                             (&local_180);
        if ((ComputationGraph *)
            local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
            _M_impl.super__Vector_impl_data._M_start != (ComputationGraph *)0x0) {
          operator_delete(local_180.
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
      }
      local_168._0_16_ = (undefined1  [16])logistic(&local_a8);
      tanh((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
      local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)extraout_RDX;
      local_180.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)extraout_RAX;
      EVar21 = cmult((Expression *)local_168,(Expression *)&local_180);
      pEVar6 = local_68[-1].
               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
               super__Vector_impl_data._M_start;
      pEVar6[uVar12].pg = EVar21.pg;
      pEVar6[uVar12].i = (int)EVar21._8_8_;
      pEVar6[uVar12].graph_id = (int)((ulong)EVar21._8_8_ >> 0x20);
      local_98 = pEVar6[uVar12].pg;
      puStack_90 = *(pointer *)&pEVar6[uVar12].i;
      if ((ExecutionEngine *)
          local_138.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
          _M_impl.super__Vector_impl_data._M_start != (ExecutionEngine *)0x0) {
        operator_delete(local_138.
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_c8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_f8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_108 = uVar12 + 1;
    } while (local_108 < this->layers);
  }
  return local_68[-1].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1];
}

Assistant:

Expression NaryTreeLSTMBuilder::add_input(int id, vector<int> children, const Expression& x) {
  DYNET_ASSERT(id >= 0 && h.size() == (unsigned)id, "Failed dimension check in TreeLSTMBuilder");
  DYNET_ASSERT(id >= 0 && c.size() == (unsigned)id, "Failed dimension check in TreeLSTMBuilder");
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();

  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    vector<Expression> i_h_children, i_c_children;
    i_h_children.reserve(children.size() > 1 ? children.size() : 1);
    i_c_children.reserve(children.size() > 1 ? children.size() : 1);

    bool has_prev_state = (children.size() > 0 || has_initial_state);
    if (children.size() == 0) {
      i_h_children.push_back(Expression());
      i_c_children.push_back(Expression());
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_children[0] = h0[i];
        i_c_children[0] = c0[i];
      }
    }
    else {  // t > 0
      for (int child : children) {
        i_h_children.push_back(h[child][i]);
        i_c_children.push_back(c[child][i]);
      }
    }

    // input
    Expression i_ait;
    if (has_prev_state) {
      vector<Expression> xs = {vars[BI], vars[X2I], in};
      xs.reserve(4 * children.size() + 3);
      for (unsigned j = 0; j < children.size(); ++j) {
        unsigned ej = (j < N) ? j : N - 1;
        xs.push_back(Lookup(i, H2I, ej));
        xs.push_back(i_h_children[j]);
        xs.push_back(Lookup(i, C2I, ej));
        xs.push_back(i_c_children[j]);
      }
      DYNET_ASSERT(xs.size() == 4 * children.size() + 3, "Failed dimension check in TreeLSTMBuilder");
      i_ait = affine_transform(xs);
    }
    else
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    Expression i_it = logistic(i_ait);

    // forget
    vector<Expression> i_ft;
    for (unsigned k = 0; k < children.size(); ++k) {
      unsigned ek = (k < N) ? k : N - 1;
      Expression i_aft;
      if (has_prev_state) {
        vector<Expression> xs = {vars[BF], vars[X2F], in};
        xs.reserve(4 * children.size() + 3);
        for (unsigned j = 0; j < children.size(); ++j) {
          unsigned ej = (j < N) ? j : N - 1;
          xs.push_back(Lookup(i, H2F, ej * N + ek));
          xs.push_back(i_h_children[j]);
          xs.push_back(Lookup(i, C2F, ej * N + ek));
          xs.push_back(i_c_children[j]);
        }
        DYNET_ASSERT(xs.size() == 4 * children.size() + 3, "Failed dimension check in TreeLSTMBuilder");
        i_aft = affine_transform(xs);
      }
      else
        i_aft = affine_transform({vars[BF], vars[X2F], in});
      i_ft.push_back(logistic(i_aft + 1.f));
    }

    // write memory cell
    Expression i_awt;
    if (has_prev_state) {
      vector<Expression> xs = {vars[BC], vars[X2C], in};
      // This is the one and only place that should *not* condition on i_c_children
      // This should condition only on x (a.k.a. in), the bias (vars[BC]) and i_h_children
      xs.reserve(2 * children.size() + 3);
      for (unsigned j = 0; j < children.size(); ++j) {
        unsigned ej = (j < N) ? j : N - 1;
        xs.push_back(Lookup(i, H2C, ej));
        xs.push_back(i_h_children[j]);
      }
      DYNET_ASSERT(xs.size() == 2 * children.size() + 3, "Failed dimension check in TreeLSTMBuilder");
      i_awt = affine_transform(xs);
    }
    else
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);

    // compute new cell value
    if (has_prev_state) {
      Expression i_nwt = cmult(i_it, i_wt);
      vector<Expression> i_crts(children.size());
      for (unsigned j = 0; j < children.size(); ++j) {
        i_crts[j] = cmult(i_ft[j], i_c_children[j]);
      }
      Expression i_crt = sum(i_crts);
      ct[i] = i_crt + i_nwt;
    }
    else {
      ct[i] = cmult(i_it, i_wt);
    }

    // output
    Expression i_aot;
    if (has_prev_state) {
      vector<Expression> xs = {vars[BO], vars[X2O], in};
      xs.reserve(4 * children.size() + 3);
      for (unsigned j = 0; j < children.size(); ++j) {
        unsigned ej = (j < N) ? j : N - 1;
        xs.push_back(Lookup(i, H2O, ej));
        xs.push_back(i_h_children[j]);
        xs.push_back(Lookup(i, C2O, ej));
        xs.push_back(i_c_children[j]);
      }
      DYNET_ASSERT(xs.size() == 4 * children.size() + 3, "Failed dimension check in TreeLSTMBuilder");
      i_aot = affine_transform(xs);
    }
    else
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    Expression i_ot = logistic(i_aot);

    // Compute new h value
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cmult(i_ot, ph_t);
  }
  return ht.back();
}